

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * path_basename(string *__return_storage_ptr__,string *name)

{
  undefined1 auVar1 [16];
  path local_b8;
  path local_78;
  string_type local_38;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_b8,name);
  auVar1 = std::experimental::filesystem::v1::__cxx11::path::_M_find_extension(&local_b8);
  if (auVar1._8_8_ == 0 || auVar1._0_8_ == 0) {
    local_78._M_pathname._M_dataplus._M_p = (pointer)&local_78._M_pathname.field_2;
    local_78._M_pathname._M_string_length = 0;
    local_78._M_pathname.field_2._M_local_buf[0] = '\0';
    local_78._M_cmpts.
    super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_cmpts.
    super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_78._M_cmpts.
    super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_78._M_cmpts.
    super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_78._49_8_ = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,auVar1._0_8_);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_78,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,local_78._M_pathname._M_dataplus._M_p,
             local_78._M_pathname._M_dataplus._M_p + local_78._M_pathname._M_string_length);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_78);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string path_basename(const std::string& name)
{
    return fs::path(name).stem().string();
}